

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultReporterFactory.cpp
# Opt level: O2

shared_ptr<ApprovalTests::Reporter> ApprovalTests::DefaultReporterFactory::getDefaultReporter(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  shared_ptr<ApprovalTests::Reporter> sVar1;
  
  defaultReporter();
  ::std::__shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (in_RDI,&defaultReporter::reporter.
                     super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>);
  sVar1.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<ApprovalTests::Reporter>)
         sVar1.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reporter> DefaultReporterFactory::getDefaultReporter()
    {
        return defaultReporter();
    }